

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_macd.c
# Opt level: O1

ErrorNumber test_func_macd(TA_History *history)

{
  TA_TestId TVar1;
  TA_RetCode TVar2;
  ErrorNumber EVar3;
  ulong uVar4;
  ulong uVar5;
  TA_Test_conflict7 *pTVar6;
  TA_Integer outNbElement;
  uint local_44;
  TA_Test_conflict7 *local_40;
  TA_Real *local_38;
  
  pTVar6 = tableTest;
  uVar5 = 0;
  do {
    if ((int)history->nbBars < pTVar6->expectedNbElement) {
      printf("TA_MACD Failed Bad Parameter for Test #%d (%d,%d)\n",uVar5 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    TVar2 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,0);
    uVar4 = 0x8a;
    if (TVar2 == TA_SUCCESS) {
      TA_SetCompatibility(pTVar6->compatibility);
      clearAllBuffers();
      setInputBuffer(0,history->close,history->nbBars);
      setInputBuffer(1,history->close,history->nbBars);
      setInputBuffer(2,history->close,history->nbBars);
      setInputBuffer(3,history->close,history->nbBars);
      local_44 = 0;
      outNbElement = 0;
      TVar1 = pTVar6->testId;
      if (TVar1 == TA_ANY_MA_TEST) {
        TVar2 = TA_MACD(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,pTVar6->optInFastPeriod,
                        pTVar6->optInSlowPeriod,pTVar6->optInSignalPeriod_2,(int *)&local_44,
                        &outNbElement,gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
      }
      else if (TVar1 == TA_ADOSC_3_10_TEST) {
        TVar2 = TA_MACDEXT(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,pTVar6->optInFastPeriod,
                           TA_MAType_EMA,pTVar6->optInSlowPeriod,TA_MAType_EMA,
                           pTVar6->optInSignalPeriod_2,TA_MAType_EMA,(int *)&local_44,&outNbElement,
                           gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
      }
      else {
        TVar2 = 0x1407;
        if (TVar1 == TA_AD_TEST) {
          TVar2 = TA_MACDFIX(pTVar6->startIdx,pTVar6->endIdx,gBuffer[0].in,
                             pTVar6->optInSignalPeriod_2,(int *)&local_44,&outNbElement,
                             gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
        }
      }
      EVar3 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
      if (EVar3 == TA_TEST_PASS) {
        EVar3 = checkExpectedValue(gBuffer[0].out0,TVar2,pTVar6->expectedRetCode,local_44,
                                   pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                                   pTVar6->oneOfTheExpectedOutReal0,
                                   pTVar6->oneOfTheExpectedOutRealIndex0);
        if (EVar3 == TA_TEST_PASS) {
          EVar3 = checkExpectedValue(gBuffer[0].out1,TVar2,pTVar6->expectedRetCode,local_44,
                                     pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement,
                                     pTVar6->oneOfTheExpectedOutReal1,
                                     pTVar6->oneOfTheExpectedOutRealIndex1);
          if (EVar3 == TA_TEST_PASS) {
            EVar3 = checkExpectedValue(gBuffer[0].out2,TVar2,pTVar6->expectedRetCode,local_44,
                                       pTVar6->expectedBegIdx,outNbElement,pTVar6->expectedNbElement
                                       ,pTVar6->oneOfTheExpectedOutReal2,
                                       pTVar6->oneOfTheExpectedOutRealIndex2);
            if (EVar3 == TA_TEST_PASS) {
              outNbElement = 0;
              local_44 = 0;
              TVar1 = pTVar6->testId;
              if (TVar1 == TA_ANY_MA_TEST) {
                TVar2 = TA_MACD(pTVar6->startIdx,pTVar6->endIdx,gBuffer[1].in,
                                pTVar6->optInFastPeriod,pTVar6->optInSlowPeriod,
                                pTVar6->optInSignalPeriod_2,(int *)&local_44,&outNbElement,
                                gBuffer[1].in,gBuffer[1].out1,gBuffer[1].out2);
              }
              else if (TVar1 == TA_ADOSC_3_10_TEST) {
                TVar2 = TA_MACDEXT(pTVar6->startIdx,pTVar6->endIdx,gBuffer[1].in,
                                   pTVar6->optInFastPeriod,TA_MAType_EMA,pTVar6->optInSlowPeriod,
                                   TA_MAType_EMA,pTVar6->optInSignalPeriod_2,TA_MAType_EMA,
                                   (int *)&local_44,&outNbElement,gBuffer[1].in,gBuffer[1].out1,
                                   gBuffer[1].out2);
              }
              else if (TVar1 == TA_AD_TEST) {
                TVar2 = TA_MACDFIX(pTVar6->startIdx,pTVar6->endIdx,gBuffer[1].in,
                                   pTVar6->optInSignalPeriod_2,(int *)&local_44,&outNbElement,
                                   gBuffer[1].in,gBuffer[1].out1,gBuffer[1].out2);
              }
              EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
              if (EVar3 == TA_TEST_PASS) {
                EVar3 = checkExpectedValue(gBuffer[1].in,TVar2,pTVar6->expectedRetCode,local_44,
                                           pTVar6->expectedBegIdx,outNbElement,
                                           pTVar6->expectedNbElement,
                                           pTVar6->oneOfTheExpectedOutReal0,
                                           pTVar6->oneOfTheExpectedOutRealIndex0);
                if (EVar3 != TA_TEST_PASS) goto LAB_00116e5e;
                EVar3 = checkExpectedValue(gBuffer[1].out1,TVar2,pTVar6->expectedRetCode,local_44,
                                           pTVar6->expectedBegIdx,outNbElement,
                                           pTVar6->expectedNbElement,
                                           pTVar6->oneOfTheExpectedOutReal1,
                                           pTVar6->oneOfTheExpectedOutRealIndex1);
                if (EVar3 != TA_TEST_PASS) goto LAB_00116ea4;
                EVar3 = checkExpectedValue(gBuffer[1].out2,TVar2,pTVar6->expectedRetCode,local_44,
                                           pTVar6->expectedBegIdx,outNbElement,
                                           pTVar6->expectedNbElement,
                                           pTVar6->oneOfTheExpectedOutReal2,
                                           pTVar6->oneOfTheExpectedOutRealIndex2);
                if (EVar3 != TA_TEST_PASS) goto LAB_00116eea;
                outNbElement = 0;
                local_44 = 0;
                TVar1 = pTVar6->testId;
                if (TVar1 == TA_ANY_MA_TEST) {
                  TVar2 = TA_MACD(pTVar6->startIdx,pTVar6->endIdx,gBuffer[2].in,
                                  pTVar6->optInFastPeriod,pTVar6->optInSlowPeriod,
                                  pTVar6->optInSignalPeriod_2,(int *)&local_44,&outNbElement,
                                  gBuffer[2].out1,gBuffer[2].in,gBuffer[2].out2);
                }
                else if (TVar1 == TA_ADOSC_3_10_TEST) {
                  TVar2 = TA_MACDEXT(pTVar6->startIdx,pTVar6->endIdx,gBuffer[2].in,
                                     pTVar6->optInFastPeriod,TA_MAType_EMA,pTVar6->optInSlowPeriod,
                                     TA_MAType_EMA,pTVar6->optInSignalPeriod_2,TA_MAType_EMA,
                                     (int *)&local_44,&outNbElement,gBuffer[2].out1,gBuffer[2].in,
                                     gBuffer[2].out2);
                }
                else {
                  TVar2 = 0x1407;
                  if (TVar1 == TA_AD_TEST) {
                    TVar2 = TA_MACDFIX(pTVar6->startIdx,pTVar6->endIdx,gBuffer[2].in,
                                       pTVar6->optInSignalPeriod_2,(int *)&local_44,&outNbElement,
                                       gBuffer[2].out1,gBuffer[2].in,gBuffer[2].out2);
                  }
                }
                EVar3 = checkSameContent(gBuffer[1].out1,gBuffer[2].in);
                if (EVar3 == TA_TEST_PASS) {
                  EVar3 = checkExpectedValue(gBuffer[2].out1,TVar2,pTVar6->expectedRetCode,local_44,
                                             pTVar6->expectedBegIdx,outNbElement,
                                             pTVar6->expectedNbElement,
                                             pTVar6->oneOfTheExpectedOutReal0,
                                             pTVar6->oneOfTheExpectedOutRealIndex0);
                  if (EVar3 != TA_TEST_PASS) goto LAB_00116e5e;
                  EVar3 = checkExpectedValue(gBuffer[2].in,TVar2,pTVar6->expectedRetCode,local_44,
                                             pTVar6->expectedBegIdx,outNbElement,
                                             pTVar6->expectedNbElement,
                                             pTVar6->oneOfTheExpectedOutReal1,
                                             pTVar6->oneOfTheExpectedOutRealIndex1);
                  if (EVar3 != TA_TEST_PASS) goto LAB_00116ea4;
                  EVar3 = checkExpectedValue(gBuffer[2].out2,TVar2,pTVar6->expectedRetCode,local_44,
                                             pTVar6->expectedBegIdx,outNbElement,
                                             pTVar6->expectedNbElement,
                                             pTVar6->oneOfTheExpectedOutReal2,
                                             pTVar6->oneOfTheExpectedOutRealIndex2);
                  if (EVar3 != TA_TEST_PASS) goto LAB_00116eea;
                  outNbElement = 0;
                  local_44 = 0;
                  TVar1 = pTVar6->testId;
                  if (TVar1 == TA_ANY_MA_TEST) {
                    TVar2 = TA_MACD(pTVar6->startIdx,pTVar6->endIdx,gBuffer[3].in,
                                    pTVar6->optInFastPeriod,pTVar6->optInSlowPeriod,
                                    pTVar6->optInSignalPeriod_2,(int *)&local_44,&outNbElement,
                                    gBuffer[3].out1,gBuffer[3].out2,gBuffer[3].in);
                  }
                  else if (TVar1 == TA_ADOSC_3_10_TEST) {
                    TVar2 = TA_MACDEXT(pTVar6->startIdx,pTVar6->endIdx,gBuffer[3].in,
                                       pTVar6->optInFastPeriod,TA_MAType_EMA,pTVar6->optInSlowPeriod
                                       ,TA_MAType_EMA,pTVar6->optInSignalPeriod_2,TA_MAType_EMA,
                                       (int *)&local_44,&outNbElement,gBuffer[3].out1,
                                       gBuffer[3].out2,gBuffer[3].in);
                  }
                  else {
                    TVar2 = 0x1407;
                    if (TVar1 == TA_AD_TEST) {
                      TVar2 = TA_MACDFIX(pTVar6->startIdx,pTVar6->endIdx,gBuffer[3].in,
                                         pTVar6->optInSignalPeriod_2,(int *)&local_44,&outNbElement,
                                         gBuffer[3].out1,gBuffer[3].out2,gBuffer[3].in);
                    }
                  }
                  EVar3 = checkSameContent(gBuffer[2].out2,gBuffer[3].in);
                  if (EVar3 == TA_TEST_PASS) {
                    EVar3 = checkExpectedValue(gBuffer[3].out1,TVar2,pTVar6->expectedRetCode,
                                               local_44,pTVar6->expectedBegIdx,outNbElement,
                                               pTVar6->expectedNbElement,
                                               pTVar6->oneOfTheExpectedOutReal0,
                                               pTVar6->oneOfTheExpectedOutRealIndex0);
                    if (EVar3 != TA_TEST_PASS) goto LAB_00116e5e;
                    EVar3 = checkExpectedValue(gBuffer[3].out2,TVar2,pTVar6->expectedRetCode,
                                               local_44,pTVar6->expectedBegIdx,outNbElement,
                                               pTVar6->expectedNbElement,
                                               pTVar6->oneOfTheExpectedOutReal1,
                                               pTVar6->oneOfTheExpectedOutRealIndex1);
                    if (EVar3 != TA_TEST_PASS) goto LAB_00116ea4;
                    EVar3 = checkExpectedValue(gBuffer[3].in,TVar2,pTVar6->expectedRetCode,local_44,
                                               pTVar6->expectedBegIdx,outNbElement,
                                               pTVar6->expectedNbElement,
                                               pTVar6->oneOfTheExpectedOutReal2,
                                               pTVar6->oneOfTheExpectedOutRealIndex2);
                    if (EVar3 != TA_TEST_PASS) goto LAB_00116eea;
                    local_38 = history->close;
                    local_40 = pTVar6;
                    if ((pTVar6->doRangeTestFlag == 0) ||
                       (EVar3 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_EMA,&local_40,3,0),
                       EVar3 == TA_TEST_PASS)) {
                      uVar4 = 0;
                      goto LAB_00116eff;
                    }
                  }
                }
              }
              goto LAB_00116e21;
            }
LAB_00116eea:
            uVar4 = (ulong)EVar3;
          }
          else {
LAB_00116ea4:
            uVar4 = (ulong)EVar3;
          }
        }
        else {
LAB_00116e5e:
          uVar4 = (ulong)EVar3;
        }
        printf("Fail for output id=%d\n");
      }
      else {
LAB_00116e21:
        uVar4 = (ulong)EVar3;
      }
    }
LAB_00116eff:
    if ((ErrorNumber)uVar4 != TA_TEST_PASS) {
      printf("TA_MACD Failed Test #%d (Code=%d)\n",uVar5 & 0xffffffff,uVar4);
      return (ErrorNumber)uVar4;
    }
    uVar5 = uVar5 + 1;
    pTVar6 = pTVar6 + 1;
    if (uVar5 == 6) {
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_macd( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "TA_MACD Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i,
                 tableTest[i].expectedNbElement,
                 history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "TA_MACD Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}